

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

void __thiscall
embree::SceneGraph::TriangleLight::TriangleLight
          (TriangleLight *this,Vec3fa *v0,Vec3fa *v1,Vec3fa *v2,Vec3fa *L)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Light *in_RDI;
  undefined8 *in_R8;
  
  Light::Light(in_RDI,LIGHT_TRIANGLE);
  uVar1 = in_RSI[1];
  *(undefined8 *)(in_RDI + 4) = *in_RSI;
  *(undefined8 *)(in_RDI + 6) = uVar1;
  uVar1 = in_RDX[1];
  *(undefined8 *)(in_RDI + 8) = *in_RDX;
  *(undefined8 *)(in_RDI + 10) = uVar1;
  uVar1 = in_RCX[1];
  *(undefined8 *)(in_RDI + 0xc) = *in_RCX;
  *(undefined8 *)(in_RDI + 0xe) = uVar1;
  uVar1 = in_R8[1];
  *(undefined8 *)(in_RDI + 0x10) = *in_R8;
  *(undefined8 *)(in_RDI + 0x12) = uVar1;
  return;
}

Assistant:

TriangleLight (const Vec3fa& v0, const Vec3fa& v1, const Vec3fa& v2, const Vec3fa& L)
        : Light(LIGHT_TRIANGLE), v0(v0), v1(v1), v2(v2), L(L) {}